

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<tcu::Vector<float,_2>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Refract<2>::doExpand
          (Refract<2> *this,ExpandContext *ctx,ArgExprs *args)

{
  deInt32 *pdVar1;
  ExprP<tcu::Vector<float,_2>_> *arg0;
  long *plVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  BuiltinPrecisionTests *this_00;
  Expr<float> *pEVar5;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_bool,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *func;
  ExprP<tcu::Vector<float,_2>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *extraout_RDX_03;
  SharedPtrStateBase *extraout_RDX_04;
  SharedPtrStateBase *extraout_RDX_05;
  SharedPtrStateBase *extraout_RDX_06;
  SharedPtrStateBase *extraout_RDX_07;
  SharedPtrStateBase *extraout_RDX_08;
  SharedPtrStateBase *extraout_RDX_09;
  SharedPtrStateBase *extraout_RDX_10;
  SharedPtrStateBase *extraout_RDX_11;
  SharedPtrStateBase *extraout_RDX_12;
  SharedPtrStateBase *extraout_RDX_13;
  SharedPtrStateBase *extraout_RDX_14;
  SharedPtrStateBase *extraout_RDX_15;
  SharedPtrStateBase *extraout_RDX_16;
  SharedPtrStateBase *extraout_RDX_17;
  SharedPtrStateBase *extraout_RDX_18;
  SharedPtrStateBase *extraout_RDX_19;
  SharedPtrStateBase *extraout_RDX_20;
  SharedPtrStateBase *extraout_RDX_21;
  SharedPtrStateBase *extraout_RDX_22;
  SharedPtrStateBase *extraout_RDX_23;
  SharedPtrStateBase *extraout_RDX_24;
  SharedPtrStateBase *extraout_RDX_25;
  SharedPtrStateBase *extraout_RDX_26;
  double __x;
  ExprP<tcu::Vector<float,_2>_> EVar7;
  ExprP<float> k;
  ExprP<float> k2;
  ExprP<float> k1;
  ExprP<float> dotNI;
  ExprP<tcu::Vector<float,_2>_> local_128;
  ExprP<float> local_118;
  ExprP<tcu::Vector<float,_2>_> local_108;
  ExprP<float> local_f8;
  ExprP<tcu::Vector<float,_2>_> local_e8;
  ExprP<tcu::Vector<float,_2>_> local_d8;
  ExprP<float> local_c8;
  ExprP<float> local_b8;
  ExprP<float> local_a8;
  string local_98;
  ExprP<float> local_78;
  ExprP<float> local_68;
  ExprP<float> local_58;
  ExprP<float> local_48;
  BuiltinPrecisionTests *local_38;
  SharedPtrStateBase *pSVar6;
  
  paVar4 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar4;
  local_38 = (BuiltinPrecisionTests *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"dotNI","");
  dot<2>((Functions *)&local_b8,in_RCX + 1,in_RCX);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_78,&local_98,(ExpandContext *)args,&local_b8);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_48);
  if (local_78.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_78.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_78.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_78.super_ExprPBase<float>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_78.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_78.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_b8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_b8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_b8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_b8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_b8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_b8.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_b8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"k1","");
  pEVar5 = (Expr<float> *)operator_new(0x10);
  (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00b3ff50;
  *(undefined4 *)&pEVar5[1].super_ExprBase._vptr_ExprBase = 0x3f800000;
  exprP<float>((BuiltinPrecisionTests *)&local_118,pEVar5);
  arg0 = in_RCX + 2;
  operator*((BuiltinPrecisionTests *)&local_c8,(ExprP<float> *)arg0,(ExprP<float> *)arg0);
  pEVar5 = (Expr<float> *)operator_new(0x10);
  (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00b3ff50;
  *(undefined4 *)&pEVar5[1].super_ExprBase._vptr_ExprBase = 0x3f800000;
  exprP<float>((BuiltinPrecisionTests *)&local_d8,pEVar5);
  operator*((BuiltinPrecisionTests *)&local_e8,&local_48,&local_48);
  operator-((BuiltinPrecisionTests *)&local_108,(ExprP<float> *)&local_d8,(ExprP<float> *)&local_e8)
  ;
  operator*((BuiltinPrecisionTests *)&local_128,&local_c8,(ExprP<float> *)&local_108);
  operator-((BuiltinPrecisionTests *)&local_f8,&local_118,(ExprP<float> *)&local_128);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_b8,&local_98,(ExpandContext *)args,&local_f8);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_78);
  if (local_b8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_b8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_b8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_b8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_b8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_b8.super_ExprPBase<float>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_b8.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_b8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_f8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_f8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_f8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_f8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_f8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_f8.super_ExprPBase<float>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_f8.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_f8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
          super_ExprPBase<tcu::Vector<float,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
           = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
          super_ExprPBase<tcu::Vector<float,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
           = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
        super_ExprPBase<tcu::Vector<float,_2>_>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
        super_ExprPBase<tcu::Vector<float,_2>_>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_c8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_c8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_c8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_c8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_c8.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_c8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_118.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_118.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_118.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_118.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_118.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"k2","");
  operator-((BuiltinPrecisionTests *)&local_e8,&local_48);
  operator*((BuiltinPrecisionTests *)&local_d8,&local_48,(ExprP<float> *)&local_e8);
  pEVar5 = (Expr<float> *)operator_new(0x10);
  (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00b3ff50;
  *(undefined4 *)&pEVar5[1].super_ExprBase._vptr_ExprBase = 0x3f800000;
  exprP<float>((BuiltinPrecisionTests *)&local_a8,pEVar5);
  operator+((BuiltinPrecisionTests *)&local_108,(ExprP<float> *)&local_d8,&local_a8);
  operator*((BuiltinPrecisionTests *)&local_c8,(ExprP<float> *)&local_108,(ExprP<float> *)arg0);
  operator-((BuiltinPrecisionTests *)&local_58,(ExprP<float> *)arg0);
  operator*((BuiltinPrecisionTests *)&local_128,&local_c8,&local_58);
  pEVar5 = (Expr<float> *)operator_new(0x10);
  (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00b3ff50;
  *(undefined4 *)&pEVar5[1].super_ExprBase._vptr_ExprBase = 0x3f800000;
  exprP<float>((BuiltinPrecisionTests *)&local_68,pEVar5);
  operator+((BuiltinPrecisionTests *)&local_118,(ExprP<float> *)&local_128,&local_68);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_f8,&local_98,(ExpandContext *)args,&local_118);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_b8);
  if (local_f8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_f8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_f8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_f8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_f8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_f8.super_ExprPBase<float>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_f8.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_f8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_118.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_118.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_118.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_118.super_ExprPBase<float>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_118.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_68.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_68.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_68.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_68.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_68.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_68.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
          super_ExprPBase<tcu::Vector<float,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
           = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_58.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_58.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_58.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_58.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_58.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_58.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_c8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_c8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_c8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_c8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_c8.super_ExprPBase<float>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_c8.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_c8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
          super_ExprPBase<tcu::Vector<float,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
           = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_a8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_a8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_a8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_a8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_a8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_a8.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_a8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
    }
  }
  if (local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
          super_ExprPBase<tcu::Vector<float,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
           = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
        super_ExprPBase<tcu::Vector<float,_2>_>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"k","");
  alternatives<float>((BuiltinPrecisionTests *)&local_128,&local_78,&local_b8);
  bindExpression<float>
            ((BuiltinPrecisionTests *)&local_118,&local_98,(ExpandContext *)args,
             (ExprP<float> *)&local_128);
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)&local_f8);
  if (local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_118.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_118.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_118.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_118.super_ExprPBase<float>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_118.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
      }
      local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
        super_ExprPBase<tcu::Vector<float,_2>_>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar4) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pEVar5 = (Expr<float> *)operator_new(0x10);
  this_00 = local_38;
  (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00b3ff50;
  *(undefined4 *)&pEVar5[1].super_ExprBase._vptr_ExprBase = 0;
  exprP<float>((BuiltinPrecisionTests *)&local_118,pEVar5);
  operator<((BuiltinPrecisionTests *)&local_98,&local_f8,&local_118);
  pEVar5 = (Expr<float> *)operator_new(0x10);
  (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00b3ff50;
  *(undefined4 *)&pEVar5[1].super_ExprBase._vptr_ExprBase = 0;
  exprP<float>((BuiltinPrecisionTests *)&local_c8,pEVar5);
  GenXType<float,_2>::genXType((GenXType<float,_2> *)&local_128,&local_c8);
  operator*((BuiltinPrecisionTests *)&local_d8,in_RCX,(ExprP<float> *)arg0);
  operator*((BuiltinPrecisionTests *)&local_58,(ExprP<float> *)arg0,&local_48);
  sqrt((Functions *)&local_68,__x);
  operator+((BuiltinPrecisionTests *)&local_a8,&local_58,&local_68);
  operator*((BuiltinPrecisionTests *)&local_e8,in_RCX + 1,&local_a8);
  operator-((BuiltinPrecisionTests *)&local_108,&local_d8,&local_e8);
  voidP();
  func = (Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_2>,_bool,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *)instance<deqp::gls::BuiltinPrecisionTests::Cond<tcu::Vector<float,2>>>();
  EVar7 = createApply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,2>,bool,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void>>
                    (this_00,func,(ExprP<bool> *)&local_98,&local_128,&local_108,&voidP::singleton);
  pSVar6 = EVar7.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
           m_state;
  if (local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX;
    }
    LOCK();
    pdVar1 = &(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
          super_ExprPBase<tcu::Vector<float,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar6 = extraout_RDX_00;
      }
      local_108.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
           = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_01;
    }
    LOCK();
    pdVar1 = &(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
          super_ExprPBase<tcu::Vector<float,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar6 = extraout_RDX_02;
      }
      local_e8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
           = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_a8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_a8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_a8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_a8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_03;
    }
    LOCK();
    pdVar1 = &(local_a8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_a8.super_ExprPBase<float>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        (*(local_a8.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
          _vptr_SharedPtrStateBase[1])();
        pSVar6 = extraout_RDX_04;
      }
      local_a8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state =
           (SharedPtrStateBase *)0x0;
    }
  }
  if (local_68.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_68.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_68.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_68.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_05;
    }
    LOCK();
    pdVar1 = &(local_68.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_68.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_68.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar6 = extraout_RDX_06;
    }
  }
  if (local_58.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_58.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_58.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_07;
    }
    LOCK();
    pdVar1 = &(local_58.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_58.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_58.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar6 = extraout_RDX_08;
    }
  }
  if (local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_09;
    }
    LOCK();
    pdVar1 = &(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
        super_ExprPBase<tcu::Vector<float,_2>_>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_d8.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[1])();
      pSVar6 = extraout_RDX_10;
    }
  }
  if (local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
      != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
           (Expr<tcu::Vector<float,_2>_> *)0x0;
      (*(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
        m_state)->_vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_11;
    }
    LOCK();
    pdVar1 = &(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
          super_ExprPBase<tcu::Vector<float,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state != (SharedPtrStateBase *)0x0) {
        (*(local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.
          m_state)->_vptr_SharedPtrStateBase[1])();
        pSVar6 = extraout_RDX_12;
      }
      local_128.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
      super_ExprPBase<tcu::Vector<float,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state
           = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_c8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_c8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_c8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_c8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_13;
    }
    LOCK();
    pdVar1 = &(local_c8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_c8.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_c8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar6 = extraout_RDX_14;
    }
  }
  if ((long *)local_98._M_string_length != (long *)0x0) {
    LOCK();
    plVar2 = (long *)(local_98._M_string_length + 8);
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      local_98._M_dataplus._M_p = (pointer)0x0;
      (**(code **)(*(long *)local_98._M_string_length + 0x10))();
      pSVar6 = extraout_RDX_15;
    }
    LOCK();
    lVar3 = local_98._M_string_length + 0xc;
    *(int *)lVar3 = *(int *)lVar3 + -1;
    UNLOCK();
    if (*(int *)lVar3 == 0) {
      if ((long *)local_98._M_string_length != (long *)0x0) {
        (**(code **)(*(long *)local_98._M_string_length + 8))();
        pSVar6 = extraout_RDX_16;
      }
      local_98._M_string_length = 0;
    }
  }
  if (local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_118.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_118.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_118.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_17;
    }
    LOCK();
    pdVar1 = &(local_118.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_118.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_118.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar6 = extraout_RDX_18;
    }
  }
  if (local_f8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_f8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_f8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_f8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_19;
    }
    LOCK();
    pdVar1 = &(local_f8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_f8.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_f8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar6 = extraout_RDX_20;
    }
  }
  if (local_b8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_b8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_b8.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_b8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_21;
    }
    LOCK();
    pdVar1 = &(local_b8.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_b8.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_b8.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar6 = extraout_RDX_22;
    }
  }
  if (local_78.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_78.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_23;
    }
    LOCK();
    pdVar1 = &(local_78.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_78.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_78.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar6 = extraout_RDX_24;
    }
  }
  if (local_48.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_48.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_48.super_ExprPBase<float>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr =
           (Expr<float> *)0x0;
      (*(local_48.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar6 = extraout_RDX_25;
    }
    LOCK();
    pdVar1 = &(local_48.super_ExprPBase<float>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
              weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_48.super_ExprPBase<float>.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_48.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar6 = extraout_RDX_26;
    }
  }
  EVar7.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_state =
       pSVar6;
  EVar7.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this_00;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar7.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&	ctx, const ArgExprs& args) const
	{
		const ExprP<Arg0>&	i		= args.a;
		const ExprP<Arg1>&	n		= args.b;
		const ExprP<float>&	eta		= args.c;
		const ExprP<float>	dotNI	= bindExpression("dotNI", ctx, dot(n, i));
		const ExprP<float>	k1		= bindExpression("k1", ctx, constant(1.0f) - eta * eta *
												(constant(1.0f) - dotNI * dotNI));

		const ExprP<float>	k2		= bindExpression("k2", ctx,
												(((dotNI * (-dotNI)) + constant(1.0f)) * eta)
												* (-eta) + constant(1.0f));
		const ExprP<float>	k		= bindExpression("k", ctx, alternatives(k1, k2));

		return cond(k < constant(0.0f),
					genXType<float, Size>(constant(0.0f)),
					i * eta - n * (eta * dotNI + sqrt(k)));
	}